

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O3

void __thiscall
testing::anon_unknown_6::BetweenCardinalityImpl::DescribeTo
          (BetweenCardinalityImpl *this,ostream *os)

{
  uint uVar1;
  ostream *this_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar2;
  long lVar3;
  char *pcVar4;
  string local_30;
  
  iVar2 = this->max_;
  if (this->min_ != 0) {
    if (this->min_ == iVar2) {
      pcVar4 = "called ";
      lVar3 = 7;
    }
    else {
      if (iVar2 != 0x7fffffff) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"called between ",0xf);
        this_00 = (ostream *)std::ostream::operator<<((ostream *)os,this->min_);
        std::__ostream_insert<char,std::char_traits<char>>(this_00," and ",5);
        os = (ostream *)std::ostream::operator<<((ostream *)this_00,this->max_);
        pcVar4 = " times";
        lVar3 = 6;
        goto LAB_00146b60;
      }
      pcVar4 = "called at least ";
      lVar3 = 0x10;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
    uVar1 = this->min_;
    iVar2 = extraout_EDX;
LAB_00146b84:
    (anonymous_namespace)::FormatTimes_abi_cxx11_
              (&local_30,(_anonymous_namespace_ *)(ulong)uVar1,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_30._M_dataplus._M_p,local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  if (iVar2 == 0x7fffffff) {
    pcVar4 = "called any number of times";
    lVar3 = 0x1a;
  }
  else {
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"called at most ",0xf);
      uVar1 = this->max_;
      iVar2 = extraout_EDX_00;
      goto LAB_00146b84;
    }
    pcVar4 = "never called";
    lVar3 = 0xc;
  }
LAB_00146b60:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
  return;
}

Assistant:

void BetweenCardinalityImpl::DescribeTo(::std::ostream* os) const {
  if (min_ == 0) {
    if (max_ == 0) {
      *os << "never called";
    } else if (max_ == INT_MAX) {
      *os << "called any number of times";
    } else {
      *os << "called at most " << FormatTimes(max_);
    }
  } else if (min_ == max_) {
    *os << "called " << FormatTimes(min_);
  } else if (max_ == INT_MAX) {
    *os << "called at least " << FormatTimes(min_);
  } else {
    // 0 < min_ < max_ < INT_MAX
    *os << "called between " << min_ << " and " << max_ << " times";
  }
}